

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g12s.c
# Opt level: O3

err_t g12sParamsVal(g12s_params *params)

{
  ec_o *ec_00;
  err_t eVar1;
  bool_t bVar2;
  size_t mov_threshold;
  void *stack;
  ec_o *ec;
  ec_o *local_28;
  
  local_28 = (ec_o *)0x0;
  eVar1 = g12sEcCreate(&local_28,params,g12sParamsVal_deep);
  ec_00 = local_28;
  if (eVar1 != 0) {
    return eVar1;
  }
  stack = (void *)((long)&(local_28->hdr).keep + (local_28->hdr).keep);
  bVar2 = ecpIsValid(local_28,stack);
  if ((bVar2 != 0) && (bVar2 = ecpSeemsValidGroup(ec_00,stack), bVar2 != 0)) {
    mov_threshold = 0x83;
    if (params->l == 0x100) {
      mov_threshold = 0x1f;
    }
    bVar2 = ecpIsSafeGroup(ec_00,mov_threshold,stack);
    if ((((bVar2 != 0) &&
         (bVar2 = ecHasOrderA(ec_00->base,ec_00,ec_00->order,ec_00->f->n,stack), bVar2 != 0)) &&
        (bVar2 = wwIsZero(ec_00->A,ec_00->f->n), bVar2 == 0)) &&
       (bVar2 = wwIsZero(ec_00->B,ec_00->f->n), bVar2 == 0)) {
      eVar1 = 0;
      goto LAB_001397ef;
    }
  }
  eVar1 = 0x1f6;
LAB_001397ef:
  blobClose(ec_00);
  return eVar1;
}

Assistant:

err_t g12sParamsVal(const g12s_params* params)
{
	err_t code;
	// состояние
	ec_o* ec = 0;
	void* stack;
	// старт
	code = g12sEcCreate(&ec, params, g12sParamsVal_deep);
	ERR_CALL_CHECK(code);
	stack = objEnd(ec, void);
	// проверить кривую, проверить J(E)
	if (!ecpIsValid(ec, stack) ||
		!ecpSeemsValidGroup(ec, stack) ||
		!ecpIsSafeGroup(ec, params->l == 256 ? 31 : 131, stack) ||
		!ecHasOrderA(ec->base, ec, ec->order, ec->f->n, stack) ||
		qrIsZero(ec->A, ec->f) || 
		qrIsZero(ec->B, ec->f))
		code = ERR_BAD_PARAMS;
	// завершение
	g12sEcClose(ec);
	return code;
}